

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O0

ptr<resp_msg> __thiscall nuraft::raft_server::handle_vote_req(raft_server *this,req_msg *req)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int32 iVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  undefined4 extraout_var;
  ulong uVar9;
  element_type *peVar10;
  element_type *peVar11;
  ulong uVar12;
  undefined4 extraout_var_00;
  char *__addr_len;
  socklen_t *psVar13;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *this_00;
  size_type sVar14;
  element_type *this_01;
  element_type *peVar15;
  element_type *peVar16;
  element_type *peVar17;
  element_type *peVar18;
  req_msg *in_RDX;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  socklen_t *in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar20;
  srv_config *s_conf;
  shared_ptr<nuraft::srv_config> *entry;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *__range2;
  ptr<cluster_config> c_conf;
  bool ignore_priority;
  bool grant;
  bool log_okay;
  ptr<resp_msg> *resp;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *in_stack_fffffffffffffc28;
  srv_state *in_stack_fffffffffffffc30;
  atomic<bool> *in_stack_fffffffffffffc38;
  msg_type *in_stack_fffffffffffffc40;
  socklen_t in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  undefined8 in_stack_fffffffffffffc68;
  srv_role _role;
  bool local_2cd;
  bool local_2c1;
  bool local_289;
  bool local_271;
  string local_1d8 [32];
  string local_1b8 [36];
  int local_194;
  string local_190 [32];
  string local_170 [32];
  element_type *local_150;
  __shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *local_148;
  _Self local_140;
  _Self local_138;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *local_130;
  string local_118 [32];
  string local_f8 [37];
  byte local_d3;
  bool local_d2;
  byte local_d1;
  undefined1 local_d0 [16];
  undefined1 local_c0 [23];
  byte local_a9;
  int32 local_a8;
  undefined4 local_a4;
  ulong local_a0;
  byte local_91;
  undefined1 local_90 [32];
  string local_70 [32];
  string local_50 [32];
  req_msg *local_30;
  
  _role = (srv_role)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  local_30 = in_RDX;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
  if (bVar1) {
    peVar15 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1c754f);
    iVar2 = (*peVar15->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar15 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c7575);
      std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1c7591);
      srv_role_to_string_abi_cxx11_(_role);
      uVar8 = std::__cxx11::string::c_str();
      uVar3 = msg_base::get_src(&local_30->super_msg_base);
      uVar9 = req_msg::get_last_log_term(local_30);
      peVar10 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c75fe);
      (*peVar10->_vptr_log_store[4])(local_90);
      peVar11 = std::
                __shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c7621);
      uVar12 = log_entry::get_term(peVar11);
      in_stack_fffffffffffffc28 =
           (list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
            *)req_msg::get_last_log_idx(local_30);
      peVar10 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c765e);
      iVar2 = (*peVar10->_vptr_log_store[2])();
      in_stack_fffffffffffffc30 = (srv_state *)(CONCAT44(extraout_var,iVar2) + -1);
      in_stack_fffffffffffffc38 = (atomic<bool> *)msg_base::get_term(&local_30->super_msg_base);
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1c76b2);
      in_stack_fffffffffffffc40 = (msg_type *)srv_state::get_term((srv_state *)0x1c76ba);
      in_stack_fffffffffffffc48 = in_RSI[0x10];
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1c76ec);
      srv_state::get_voted_for((srv_state *)0x1c76f4);
      msg_if_given_abi_cxx11_
                ((char *)local_50,
                 "[VOTE REQ] my role %s, from peer %d, log term: req %lu / mine %lu\nlast idx: req %lu / mine %lu, term: req %lu / mine %lu\npriority: target %d / mine %d, voted_for %d"
                 ,uVar8,(ulong)uVar3,uVar9,uVar12);
      (*peVar15->_vptr_logger[8])
                (peVar15,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"handle_vote_req",0x122,local_50);
      std::__cxx11::string::~string(local_50);
      std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1c77d4);
      std::__cxx11::string::~string(local_70);
    }
  }
  local_91 = 0;
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1c786b);
  local_a0 = srv_state::get_term((srv_state *)0x1c7873);
  local_a4 = 2;
  local_a8 = msg_base::get_src(&local_30->super_msg_base);
  cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int>
            ((unsigned_long *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40,(int *)in_stack_fffffffffffffc38,
             (int *)in_stack_fffffffffffffc30);
  local_d1 = 0;
  uVar9 = req_msg::get_last_log_term(local_30);
  peVar10 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1c7911);
  (*peVar10->_vptr_log_store[4])(local_c0);
  peVar11 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1c7934);
  uVar12 = log_entry::get_term(peVar11);
  local_271 = true;
  if (uVar9 <= uVar12) {
    uVar9 = req_msg::get_last_log_term(local_30);
    peVar10 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c7993);
    (*peVar10->_vptr_log_store[4])(local_d0);
    local_d1 = 1;
    peVar11 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c79be);
    uVar12 = log_entry::get_term(peVar11);
    local_289 = false;
    if (uVar9 == uVar12) {
      peVar10 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c7a02);
      iVar2 = (*peVar10->_vptr_log_store[2])();
      uVar9 = req_msg::get_last_log_idx(local_30);
      local_289 = CONCAT44(extraout_var_00,iVar2) - 1U <= uVar9;
    }
    local_271 = local_289;
  }
  if ((local_d1 & 1) != 0) {
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1c7a94);
  }
  std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1c7aa1);
  local_a9 = local_271;
  __addr_len = (char *)msg_base::get_term(&local_30->super_msg_base);
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1c7adc);
  psVar13 = (socklen_t *)srv_state::get_term((srv_state *)0x1c7ae4);
  local_2c1 = false;
  if (((socklen_t *)__addr_len == psVar13) && (local_2c1 = false, (local_a9 & 1) != 0)) {
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1c7b3b);
    uVar3 = srv_state::get_voted_for((srv_state *)0x1c7b43);
    uVar4 = msg_base::get_src(&local_30->super_msg_base);
    __addr_len = (char *)(ulong)uVar3;
    local_2cd = true;
    if (uVar3 != uVar4) {
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1c7b91);
      iVar2 = srv_state::get_voted_for((srv_state *)0x1c7b99);
      local_2cd = iVar2 == -1;
    }
    local_2c1 = local_2cd;
  }
  local_d2 = local_2c1;
  local_d3 = 0;
  this_00 = req_msg::log_entries(local_30);
  sVar14 = std::
           vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ::size(this_00);
  if (sVar14 != 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
    if (bVar1) {
      peVar15 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c7c3b);
      iVar2 = (*peVar15->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar15 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1c7c74);
        msg_if_given_abi_cxx11_
                  ((char *)local_f8,"[VOTE REQ] force vote request, will ignore priority");
        __addr_len = "handle_vote_req";
        (*peVar15->_vptr_logger[8])
                  (peVar15,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_vote_req",0x137,local_f8);
        std::__cxx11::string::~string(local_f8);
      }
    }
    local_d3 = 1;
  }
  bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffc38);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
    if (bVar1) {
      peVar15 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c7dc6);
      iVar2 = (*peVar15->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar15 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1c7dff);
        msg_if_given_abi_cxx11_
                  ((char *)local_118,
                   "[VOTE REQ] this server is catching-up with leader, will ignore priority");
        __addr_len = "handle_vote_req";
        (*peVar15->_vptr_logger[8])
                  (peVar15,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_vote_req",0x13c,local_118);
        std::__cxx11::string::~string(local_118);
      }
    }
    local_d3 = 1;
  }
  if ((local_d2 & 1U) == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
    _Var19._M_pi = extraout_RDX_00;
    if (bVar1) {
      peVar15 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c84fe);
      iVar2 = (*peVar15->_vptr_logger[7])();
      _Var19._M_pi = extraout_RDX_01;
      if (3 < iVar2) {
        peVar15 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1c8531);
        peVar16 = std::
                  __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1c8543);
        uVar9 = msg_base::get_term(&peVar16->super_msg_base);
        msg_if_given_abi_cxx11_((char *)local_1d8,"decision: X (deny), term %lu",uVar9);
        (*peVar15->_vptr_logger[8])
                  (peVar15,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_vote_req",0x15c,local_1d8);
        std::__cxx11::string::~string(local_1d8);
        _Var19._M_pi = extraout_RDX_02;
      }
    }
  }
  else {
    get_config((raft_server *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    this_01 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c7ec2);
    local_130 = cluster_config::get_servers_abi_cxx11_(this_01);
    local_138._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         ::begin(in_stack_fffffffffffffc28);
    local_140._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         ::end(in_stack_fffffffffffffc28);
    while( true ) {
      bVar1 = std::operator!=(&local_138,&local_140);
      iVar2 = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
      if (!bVar1) break;
      local_148 = &std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
                             ((_List_iterator<std::shared_ptr<nuraft::srv_config>_> *)
                              in_stack_fffffffffffffc30)->
                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>;
      local_150 = std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::get(local_148);
      if ((local_d3 & 1) == 0) {
        uVar3 = srv_config::get_id(local_150);
        uVar4 = msg_base::get_src(&local_30->super_msg_base);
        __addr_len = (char *)(ulong)uVar4;
        if (((uVar3 == uVar4) && (iVar5 = srv_config::get_priority(local_150), iVar5 != 0)) &&
           (iVar5 = srv_config::get_priority(local_150), __addr_len = (char *)in_RSI,
           iVar5 < (int)in_RSI[0x10])) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
          if (bVar1) {
            peVar15 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1c802b);
            iVar2 = (*peVar15->_vptr_logger[7])();
            if (3 < iVar2) {
              peVar15 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1c8064);
              uVar3 = in_RSI[0xe];
              uVar4 = srv_config::get_id(local_150);
              uVar6 = srv_config::get_priority(local_150);
              msg_if_given_abi_cxx11_
                        ((char *)local_170,
                         "I (%d) could vote for peer %d, but priority %d is lower than %d",
                         (ulong)uVar3,(ulong)uVar4,(ulong)uVar6,(ulong)in_RSI[0x10]);
              (*peVar15->_vptr_logger[8])
                        (peVar15,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                         ,"handle_vote_req",0x150,local_170);
              std::__cxx11::string::~string(local_170);
            }
          }
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
          if (bVar1) {
            peVar15 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1c819a);
            iVar2 = (*peVar15->_vptr_logger[7])();
            if (3 < iVar2) {
              peVar15 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1c81d3);
              msg_if_given_abi_cxx11_((char *)local_190,"decision: X (deny)\n");
              (*peVar15->_vptr_logger[8])
                        (peVar15,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                         ,"handle_vote_req",0x151,local_190);
              std::__cxx11::string::~string(local_190);
            }
          }
          local_91 = 1;
          local_194 = 1;
          goto LAB_001c8498;
        }
      }
      std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator++(&local_138);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
    if (bVar1) {
      peVar15 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c82b9);
      iVar7 = (*peVar15->_vptr_logger[7])();
      if (3 < iVar7) {
        peVar15 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1c82f2);
        uVar3 = msg_base::get_src(&local_30->super_msg_base);
        peVar16 = std::
                  __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1c831d);
        uVar9 = msg_base::get_term(&peVar16->super_msg_base);
        msg_if_given_abi_cxx11_
                  ((char *)local_1b8,"decision: O (grant), voted_for %d, term %lu",(ulong)uVar3,
                   uVar9);
        __addr_len = "handle_vote_req";
        (*peVar15->_vptr_logger[8])
                  (peVar15,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_vote_req",0x157,local_1b8);
        std::__cxx11::string::~string(local_1b8);
      }
    }
    peVar16 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1c83cc);
    peVar10 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c83e5);
    iVar7 = (*peVar10->_vptr_log_store[2])();
    resp_msg::accept(peVar16,iVar7,__addr,(socklen_t *)__addr_len);
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1c841d);
    msg_base::get_src(&local_30->super_msg_base);
    srv_state::set_voted_for(in_stack_fffffffffffffc30,iVar2);
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1c8459);
    peVar17 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c8461);
    peVar18 = std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffc30);
    (*peVar17->_vptr_state_mgr[4])(peVar17,peVar18);
    local_194 = 0;
LAB_001c8498:
    std::shared_ptr<nuraft::cluster_config>::~shared_ptr
              ((shared_ptr<nuraft::cluster_config> *)0x1c84a5);
    _Var19._M_pi = extraout_RDX;
    if (local_194 != 0) goto LAB_001c85e7;
  }
  local_91 = 1;
  local_194 = 1;
LAB_001c85e7:
  if ((local_91 & 1) == 0) {
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1c85fe);
    _Var19._M_pi = extraout_RDX_03;
  }
  pVar20.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var19._M_pi;
  pVar20.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar20.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_vote_req(req_msg& req) {
    p_in("[VOTE REQ] my role %s, from peer %d, "
         "log term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "last idx: req %" PRIu64 " / mine %" PRIu64
         ", term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "priority: target %d / mine %d, voted_for %d",
         srv_role_to_string(role_).c_str(),
         req.get_src(), req.get_last_log_term(), log_store_->last_entry()->get_term(),
         req.get_last_log_idx(), log_store_->next_slot()-1,
         req.get_term(), state_->get_term(),
         target_priority_, my_priority_, state_->get_voted_for());

    ptr<resp_msg> resp( cs_new<resp_msg>
                        ( state_->get_term(),
                          msg_type::request_vote_response,
                          id_,
                          req.get_src() ) );

    bool log_okay =
        req.get_last_log_term() > log_store_->last_entry()->get_term() ||
        ( req.get_last_log_term() == log_store_->last_entry()->get_term() &&
          log_store_->next_slot() - 1 <= req.get_last_log_idx() );

    bool grant =
        req.get_term() == state_->get_term() &&
        log_okay &&
        ( state_->get_voted_for() == req.get_src() ||
          state_->get_voted_for() == -1 );

    bool ignore_priority = false;
    if (req.log_entries().size() > 0) {
        p_in("[VOTE REQ] force vote request, will ignore priority");
        ignore_priority = true;
    }
    if (catching_up_) {
        p_in("[VOTE REQ] this server is catching-up with leader, "
             "will ignore priority");
        ignore_priority = true;
    }

    if (grant) {
        ptr<cluster_config> c_conf = get_config();
        for (auto& entry: c_conf->get_servers()) {
            srv_config* s_conf = entry.get();
            if ( !ignore_priority &&
                 s_conf->get_id() == req.get_src() &&
                 s_conf->get_priority() &&
                 s_conf->get_priority() < target_priority_ ) {
                // NOTE:
                //   If zero-priority member initiates leader election,
                //   that is intentionally triggered by the flag in
                //   `raft_params`. In such case, we don't check the
                //   priority.
                p_in("I (%d) could vote for peer %d, "
                     "but priority %d is lower than %d",
                     id_, s_conf->get_id(),
                     s_conf->get_priority(), target_priority_);
                p_in("decision: X (deny)\n");
                return resp;
            }
        }

        p_in("decision: O (grant), voted_for %d, term %" PRIu64,
             req.get_src(), resp->get_term());
        resp->accept(log_store_->next_slot());
        state_->set_voted_for(req.get_src());
        ctx_->state_mgr_->save_state(*state_);
    } else {
        p_in("decision: X (deny), term %" PRIu64, resp->get_term());
    }

    return resp;
}